

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlTruncate(sqlite3_file *pJfd,sqlite_int64 size)

{
  FileChunk *pFVar1;
  FileChunk *pTmp;
  FileChunk *pChunk;
  MemJournal *p;
  sqlite_int64 size_local;
  sqlite3_file *pJfd_local;
  
  pTmp = (FileChunk *)pJfd[1].pMethods;
  while (pTmp != (FileChunk *)0x0) {
    pFVar1 = pTmp->pNext;
    sqlite3_free(pTmp);
    pTmp = pFVar1;
  }
  sqlite3MemJournalOpen(pJfd);
  return 0;
}

Assistant:

static int memjrnlTruncate(sqlite3_file *pJfd, sqlite_int64 size){
  MemJournal *p = (MemJournal *)pJfd;
  FileChunk *pChunk;
  assert(size==0);
  UNUSED_PARAMETER(size);
  pChunk = p->pFirst;
  while( pChunk ){
    FileChunk *pTmp = pChunk;
    pChunk = pChunk->pNext;
    sqlite3_free(pTmp);
  }
  sqlite3MemJournalOpen(pJfd);
  return SQLITE_OK;
}